

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O1

int ssl_double_retransmit_timeout(mbedtls_ssl_context *ssl)

{
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = ssl->handshake->retransmit_timeout;
  iVar3 = -1;
  if (uVar2 < ssl->conf->hs_timeout_max) {
    if (uVar2 != ssl->conf->hs_timeout_min) {
      ssl->handshake->mtu = 0x1fc;
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0x1f1,"mtu autoreduction to %d bytes",0x1fc);
    }
    uVar1 = ssl->handshake->retransmit_timeout;
    if (((int)uVar1 < 0) || (uVar2 = uVar1 * 2, ssl->conf->hs_timeout_max < uVar2)) {
      uVar2 = ssl->conf->hs_timeout_max;
    }
    ssl->handshake->retransmit_timeout = uVar2;
    iVar3 = 0;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x1fe,"update timeout value to %lu millisecs",(ulong)uVar2);
  }
  return iVar3;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_double_retransmit_timeout(mbedtls_ssl_context *ssl)
{
    uint32_t new_timeout;

    if (ssl->handshake->retransmit_timeout >= ssl->conf->hs_timeout_max) {
        return -1;
    }

    /* Implement the final paragraph of RFC 6347 section 4.1.1.1
     * in the following way: after the initial transmission and a first
     * retransmission, back off to a temporary estimated MTU of 508 bytes.
     * This value is guaranteed to be deliverable (if not guaranteed to be
     * delivered) of any compliant IPv4 (and IPv6) network, and should work
     * on most non-IP stacks too. */
    if (ssl->handshake->retransmit_timeout != ssl->conf->hs_timeout_min) {
        ssl->handshake->mtu = 508;
        MBEDTLS_SSL_DEBUG_MSG(2, ("mtu autoreduction to %d bytes", ssl->handshake->mtu));
    }

    new_timeout = 2 * ssl->handshake->retransmit_timeout;

    /* Avoid arithmetic overflow and range overflow */
    if (new_timeout < ssl->handshake->retransmit_timeout ||
        new_timeout > ssl->conf->hs_timeout_max) {
        new_timeout = ssl->conf->hs_timeout_max;
    }

    ssl->handshake->retransmit_timeout = new_timeout;
    MBEDTLS_SSL_DEBUG_MSG(3, ("update timeout value to %lu millisecs",
                              (unsigned long) ssl->handshake->retransmit_timeout));

    return 0;
}